

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.h
# Opt level: O2

MemoryBuffer * __thiscall llvm::SourceMgr::getMemoryBuffer(SourceMgr *this,uint i)

{
  pointer pSVar1;
  
  if (i != 0) {
    pSVar1 = (this->Buffers).
             super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)i <=
        (ulong)(((long)(this->Buffers).
                       super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x18)) {
      return (MemoryBuffer *)
             (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)
             *(tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_> *)
              &pSVar1[i - 1].Buffer._M_t;
    }
  }
  __assert_fail("isValidBufferID(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/SourceMgr.h"
                ,0x84,"const MemoryBuffer *llvm::SourceMgr::getMemoryBuffer(unsigned int) const");
}

Assistant:

bool isValidBufferID(unsigned i) const { return i && i <= Buffers.size(); }